

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O0

void __thiscall leveldb::Benchmark::ReadSequential(Benchmark *this)

{
  sqlite3 *psVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  int local_48;
  allocator local_41;
  int i;
  string read_str;
  undefined8 local_20;
  sqlite3_stmt *pStmt;
  Benchmark *pBStack_10;
  int status;
  Benchmark *this_local;
  
  pBStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"SELECT * FROM test ORDER BY key",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  psVar1 = this->db_;
  uVar4 = std::__cxx11::string::c_str();
  pStmt._4_4_ = sqlite3_prepare_v2(psVar1,uVar4,0xffffffff,&local_20,0);
  ErrorCheck(pStmt._4_4_);
  local_48 = 0;
  while( true ) {
    bVar5 = false;
    if (local_48 < this->reads_) {
      iVar2 = sqlite3_step(local_20);
      bVar5 = iVar2 == 100;
    }
    if (!bVar5) break;
    iVar2 = sqlite3_column_bytes(local_20,1);
    iVar3 = sqlite3_column_bytes(local_20,2);
    this->bytes_ = (long)(iVar2 + iVar3) + this->bytes_;
    FinishedSingleOp(this);
    local_48 = local_48 + 1;
  }
  pStmt._4_4_ = sqlite3_finalize(local_20);
  ErrorCheck(pStmt._4_4_);
  std::__cxx11::string::~string((string *)&i);
  return;
}

Assistant:

void ReadSequential() {
    int status;
    sqlite3_stmt* pStmt;
    std::string read_str = "SELECT * FROM test ORDER BY key";

    status = sqlite3_prepare_v2(db_, read_str.c_str(), -1, &pStmt, nullptr);
    ErrorCheck(status);
    for (int i = 0; i < reads_ && SQLITE_ROW == sqlite3_step(pStmt); i++) {
      bytes_ += sqlite3_column_bytes(pStmt, 1) + sqlite3_column_bytes(pStmt, 2);
      FinishedSingleOp();
    }

    status = sqlite3_finalize(pStmt);
    ErrorCheck(status);
  }